

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info_test_helper.cc
# Opt level: O1

void __thiscall
google::protobuf::util::converter::testing::TypeInfoTestHelper::ResetTypeInfo
          (TypeInfoTestHelper *this,
          vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
          *descriptors)

{
  DescriptorPool *pool;
  long *plVar1;
  TypeInfoTestHelper *pTVar2;
  LogMessage *pLVar3;
  pointer ppDVar4;
  TypeResolver *pTVar5;
  TypeInfo *pTVar6;
  ulong uVar7;
  LogMessage local_90;
  string local_58;
  TypeInfoTestHelper *local_38;
  
  if (*(int *)this == 0) {
    ppDVar4 = (descriptors->
              super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pool = *(DescriptorPool **)(*(long *)(*ppDVar4 + 0x10) + 0x10);
    local_38 = this;
    if (8 < (ulong)((long)(descriptors->
                          super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar4)) {
      uVar7 = 1;
      do {
        if (pool != *(DescriptorPool **)(*(long *)(ppDVar4[uVar7] + 0x10) + 0x10)) {
          protobuf::internal::LogMessage::LogMessage
                    (&local_90,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/internal/type_info_test_helper.cc"
                     ,0x3c);
          pLVar3 = protobuf::internal::LogMessage::operator<<
                             (&local_90,"CHECK failed: pool == descriptors[i]->file()->pool(): ");
          pLVar3 = protobuf::internal::LogMessage::operator<<
                             (pLVar3,"Descriptors from different pools are not supported.");
          protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_58,pLVar3);
          protobuf::internal::LogMessage::~LogMessage(&local_90);
        }
        uVar7 = uVar7 + 1;
        ppDVar4 = (descriptors->
                  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar7 < (ulong)((long)(descriptors->
                                     super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar4 >>
                              3));
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"type.googleapis.com","");
    pTVar5 = NewTypeResolverForDescriptorPool(&local_58,pool);
    pTVar2 = local_38;
    plVar1 = *(long **)(local_38 + 0x10);
    *(TypeResolver **)(local_38 + 0x10) = pTVar5;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    pTVar6 = TypeInfo::NewTypeInfo(*(TypeResolver **)(pTVar2 + 0x10));
    plVar1 = *(long **)(pTVar2 + 8);
    *(TypeInfo **)(pTVar2 + 8) = pTVar6;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  else {
    protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/internal/type_info_test_helper.cc"
               ,0x45);
    pLVar3 = protobuf::internal::LogMessage::operator<<(&local_90,"Can not reach here.");
    protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_58,pLVar3);
    protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  return;
}

Assistant:

void TypeInfoTestHelper::ResetTypeInfo(
    const std::vector<const Descriptor*>& descriptors) {
  switch (type_) {
    case USE_TYPE_RESOLVER: {
      const DescriptorPool* pool = descriptors[0]->file()->pool();
      for (int i = 1; i < descriptors.size(); ++i) {
        GOOGLE_CHECK(pool == descriptors[i]->file()->pool())
            << "Descriptors from different pools are not supported.";
      }
      type_resolver_.reset(
          NewTypeResolverForDescriptorPool(kTypeServiceBaseUrl, pool));
      typeinfo_.reset(TypeInfo::NewTypeInfo(type_resolver_.get()));
      return;
    }
  }
  GOOGLE_LOG(FATAL) << "Can not reach here.";
}